

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int discard_sentmap_by_epoch(quicly_conn_t *conn,uint ack_epochs)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  uint in_ESI;
  quicly_sentmap_t *in_RDI;
  int ret;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  quicly_sentmap_event_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = init_acks_iter((quicly_conn_t *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
  do {
    if (iVar1 != 0) {
      return iVar1;
    }
    while( true ) {
      pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x14181b);
      if (pqVar2->packet_number == 0xffffffffffffffff) {
        return iVar1;
      }
      if ((in_ESI & 1 << (pqVar2->ack_epoch & 0x1f)) != 0) break;
      quicly_sentmap_skip((quicly_sentmap_iter_t *)0x141881);
    }
    iVar1 = quicly_sentmap_update
                      (in_RDI,(quicly_sentmap_iter_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe4);
  } while( true );
}

Assistant:

int discard_sentmap_by_epoch(quicly_conn_t *conn, unsigned ack_epochs)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if ((ack_epochs & (1u << sent->ack_epoch)) != 0) {
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_EXPIRED)) != 0)
                return ret;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return ret;
}